

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O1

void __thiscall Chromosome::walkPath(Chromosome *this)

{
  pointer *pppVar1;
  int iVar2;
  int iVar3;
  pointer ppVar4;
  undefined8 uVar5;
  iterator __position;
  int iVar6;
  pointer pCVar7;
  pointer pCVar8;
  undefined8 *puVar9;
  size_type sVar10;
  size_type extraout_RDX;
  int iVar11;
  ulong uVar12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  pair<Coordinate,_Coordinate> local_58;
  vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
  *local_40;
  long local_38;
  
  this->collisions = 0;
  ppVar4 = (this->pairs).
           super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pairs).
      super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
    (this->pairs).
    super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
  }
  pCVar7 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar7) {
    local_40 = (vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
                *)&this->pairs;
    lVar15 = 0x18;
    uVar18 = 0;
    do {
      uVar17 = uVar18 + 2;
      pCVar8 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar10 = ((long)(this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 2) *
               -0x5555555555555555;
      if (uVar17 < sVar10) {
        iVar2 = pCVar7[uVar18].x;
        iVar3 = pCVar7[uVar18].y;
        lVar16 = lVar15;
        local_38 = lVar15;
        do {
          iVar13 = *(int *)((long)&pCVar8->x + lVar16);
          iVar11 = *(int *)((long)&pCVar8->y + lVar16);
          if ((iVar2 == iVar13) && (iVar3 == iVar11)) {
            this->collisions = this->collisions + 1;
          }
          uVar12 = uVar18;
          if (GeneticAlgorithm::params.sequence._M_string_length <= uVar18) {
LAB_0010aa17:
            pcVar14 = "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)";
            sVar10 = GeneticAlgorithm::params.sequence._M_string_length;
            goto LAB_0010aa1a;
          }
          if (GeneticAlgorithm::params.sequence._M_dataplus._M_p[uVar18] == '1') {
            uVar12 = uVar17;
            if (GeneticAlgorithm::params.sequence._M_string_length <= uVar17) goto LAB_0010aa17;
            if (GeneticAlgorithm::params.sequence._M_dataplus._M_p[uVar17] != '\0') {
              if (sVar10 <= uVar18) {
                do {
                  pcVar14 = 
                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
                  uVar12 = uVar18;
LAB_0010aa1a:
                  std::__throw_out_of_range_fmt(pcVar14,uVar12,sVar10);
                  sVar10 = extraout_RDX;
                } while( true );
              }
              iVar13 = iVar13 - pCVar8[uVar18].x;
              iVar6 = -iVar13;
              if (0 < iVar13) {
                iVar6 = iVar13;
              }
              iVar11 = iVar11 - pCVar8[uVar18].y;
              iVar13 = -iVar11;
              if (0 < iVar11) {
                iVar13 = iVar11;
              }
              if (iVar13 + iVar6 == 1) {
                pCVar7 = pCVar8 + uVar18;
                puVar9 = (undefined8 *)((long)&pCVar8->x + lVar16);
                local_58.first.facing = pCVar7->facing;
                local_58.first.x = pCVar7->x;
                local_58.first.y = pCVar7->y;
                local_58.second.facing = *(FACING *)(puVar9 + 1);
                uVar5 = *puVar9;
                local_58.second.x = (int)uVar5;
                local_58.second.y = (int)((ulong)uVar5 >> 0x20);
                __position._M_current =
                     (this->pairs).
                     super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->pairs).
                    super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::pair<Coordinate,Coordinate>,std::allocator<std::pair<Coordinate,Coordinate>>>
                  ::_M_realloc_insert<std::pair<Coordinate,Coordinate>>
                            (local_40,__position,&local_58);
                  lVar15 = local_38;
                }
                else {
                  ((__position._M_current)->second).y = local_58.second.y;
                  ((__position._M_current)->second).facing = local_58.second.facing;
                  ((__position._M_current)->first).x = local_58.first.x;
                  ((__position._M_current)->first).y = local_58.first.y;
                  *(ulong *)&((__position._M_current)->first).facing =
                       CONCAT44(local_58.second.x,local_58.first.facing);
                  pppVar1 = &(this->pairs).
                             super__Vector_base<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar1 = *pppVar1 + 1;
                }
              }
            }
          }
          uVar17 = uVar17 + 1;
          pCVar8 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          sVar10 = ((long)(this->pathList).
                          super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pCVar8 >> 2) *
                   -0x5555555555555555;
          lVar16 = lVar16 + 0xc;
        } while (uVar17 < sVar10);
      }
      uVar18 = uVar18 + 1;
      pCVar7 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0xc;
    } while (uVar18 < (ulong)(((long)(this->pathList).
                                     super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 2)
                             * -0x5555555555555555));
  }
  return;
}

Assistant:

void Chromosome::walkPath() {

    // reset collisions counter;
    this->collisions = 0;
    pairs.clear();


    Coordinate cord1;
    Coordinate cord2;

    for (size_t i = 0; i < pathList.size(); i++){
        cord1 =  pathList.at(i);
        for(size_t j = i + 2; j < pathList.size(); j++){
            cord2 = pathList.at(j);
            if(cord1.x == cord2.x && cord1.y == cord2.y) {
                collisions++;
            }
            if(GeneticAlgorithm::params.sequence.at(i) == '1' && GeneticAlgorithm::params.sequence.at(j)){
                if (isPair(pathList.at(i), pathList.at(j))){
                    pairs.push_back(std::make_pair<Coordinate, Coordinate>(
                            (Coordinate &&) pathList.at(i),
                            (Coordinate &&) pathList.at(j))
                    );
                }
            }
        }
    }
}